

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

bool __thiscall
DisasmReplayer::enqueue_create_pipeline_layout
          (DisasmReplayer *this,Hash hash,VkPipelineLayoutCreateInfo *create_info,
          VkPipelineLayout *layout)

{
  pointer *pppVVar1;
  pointer *pppVVar2;
  iterator __position;
  iterator __position_00;
  ulong extraout_RAX;
  VkPipelineLayoutCreateInfo *local_20;
  
  local_20 = create_info;
  if (this->device == (VulkanDevice *)0x0) {
    *layout = (VkPipelineLayout)hash;
  }
  else {
    enqueue_create_pipeline_layout();
    if ((extraout_RAX & 1) == 0) {
      return false;
    }
  }
  __position._M_current =
       (this->pipeline_layouts).
       super__Vector_base<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->pipeline_layouts).
      super__Vector_base<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkPipelineLayout_T*,std::allocator<VkPipelineLayout_T*>>::
    _M_realloc_insert<VkPipelineLayout_T*const&>
              ((vector<VkPipelineLayout_T*,std::allocator<VkPipelineLayout_T*>> *)
               &this->pipeline_layouts,__position,layout);
  }
  else {
    *__position._M_current = *layout;
    pppVVar2 = &(this->pipeline_layouts).
                super__Vector_base<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppVVar2 = *pppVVar2 + 1;
  }
  __position_00._M_current =
       (this->pipeline_layout_infos).
       super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->pipeline_layout_infos).
      super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkPipelineLayoutCreateInfo_const*,std::allocator<VkPipelineLayoutCreateInfo_const*>>
    ::_M_realloc_insert<VkPipelineLayoutCreateInfo_const*const&>
              ((vector<VkPipelineLayoutCreateInfo_const*,std::allocator<VkPipelineLayoutCreateInfo_const*>>
                *)&this->pipeline_layout_infos,__position_00,&local_20);
  }
  else {
    *__position_00._M_current = create_info;
    pppVVar1 = &(this->pipeline_layout_infos).
                super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  return true;
}

Assistant:

bool enqueue_create_pipeline_layout(Hash hash, const VkPipelineLayoutCreateInfo *create_info, VkPipelineLayout *layout) override
	{
		if (device)
		{
			LOGI("Creating pipeline layout 0%" PRIX64 "\n", hash);
			if (vkCreatePipelineLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*layout = fake_handle<VkPipelineLayout>(hash);

		pipeline_layouts.push_back(*layout);
		pipeline_layout_infos.push_back(create_info);
		return true;
	}